

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BRDFile.cpp
# Opt level: O0

void __thiscall BRDFile::BRDFile(BRDFile *this,vector<char,_std::allocator<char>_> *buf)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined8 uVar4;
  void *pvVar5;
  reference ppcVar6;
  size_type sVar7;
  long lVar8;
  reference pBVar9;
  mapped_type *ppcVar10;
  reference pvVar11;
  vector<char,_std::allocator<char>_> *in_RSI;
  undefined8 *in_RDI;
  out_of_range *e;
  BRDPin *pin_1;
  iterator __end1_2;
  iterator __begin1_2;
  vector<BRDPin,_std::allocator<BRDPin>_> *__range1_2;
  BRDNail *nail_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<BRDNail,_std::allocator<BRDNail>_> *__range1_1;
  unordered_map<int,_const_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  nailsToNets;
  BRDNail nail;
  BRDPin pin;
  BRDPart part;
  BRDPoint fmt;
  uint tmp;
  char *s;
  char *p;
  char *line;
  iterator __end1;
  iterator __begin1;
  vector<char_*,_std::allocator<char_*>_> *__range1;
  vector<char_*,_std::allocator<char_*>_> lines;
  int current_block;
  int c;
  char x;
  size_t i;
  char *arena_end;
  char *arena;
  size_t file_buf_size;
  size_type buffer_size;
  vector<BRDNail,_std::allocator<BRDNail>_> *in_stack_fffffffffffff278;
  undefined4 in_stack_fffffffffffff280;
  BRDPartMountingSide in_stack_fffffffffffff284;
  value_type *in_stack_fffffffffffff288;
  BRDPart *in_stack_fffffffffffff290;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_fffffffffffff298;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_fffffffffffff2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff2b0;
  uint in_stack_fffffffffffff2b8;
  uint in_stack_fffffffffffff2bc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff2c0;
  string *in_stack_fffffffffffff2c8;
  BRDFileBase *in_stack_fffffffffffff2d0;
  anon_class_16_2_d7082a65 *in_stack_fffffffffffff3c0;
  __normal_iterator<BRDPin_*,_std::vector<BRDPin,_std::allocator<BRDPin>_>_> local_bf8;
  undefined8 *local_bf0;
  uint local_be4;
  reference local_be0;
  BRDNail *local_bd8;
  __normal_iterator<BRDNail_*,_std::vector<BRDNail,_std::allocator<BRDNail>_>_> local_bd0;
  undefined8 *local_bc8;
  undefined1 *local_b88;
  undefined1 *local_b80;
  long *local_b78;
  undefined1 **local_b70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b68;
  undefined1 *local_b58;
  uint local_b48;
  undefined4 local_b44;
  undefined4 local_b40;
  int local_b3c;
  char *local_b38;
  string local_b30 [39];
  allocator<char> local_b09;
  string local_b08 [32];
  string local_ae8 [32];
  string local_ac8 [32];
  string local_aa8 [32];
  string local_a88 [32];
  string local_a68 [32];
  string local_a48 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a28;
  undefined1 *local_a08;
  undefined1 *local_a00;
  long *local_9f8;
  undefined1 **local_9f0;
  string local_9e8 [39];
  allocator<char> local_9c1;
  string local_9c0 [32];
  string local_9a0 [32];
  string local_980 [32];
  string local_960 [32];
  string local_940 [32];
  string local_920 [32];
  string local_900 [32];
  string local_8e0 [32];
  char **local_8c0;
  undefined4 local_8b0;
  undefined4 local_8ac;
  undefined4 local_8a8;
  uint local_8a4;
  char *local_898;
  string local_878 [39];
  allocator<char> local_851;
  string local_850 [32];
  string local_830 [32];
  string local_810 [32];
  string local_7f0 [32];
  string local_7d0 [32];
  string local_7b0 [32];
  string local_790 [32];
  string local_770 [32];
  string local_750 [39];
  allocator<char> local_729;
  string local_728 [32];
  string local_708 [32];
  string local_6e8 [32];
  string local_6c8 [32];
  string local_6a8 [32];
  string local_688 [32];
  string local_668 [32];
  string local_648 [32];
  undefined1 *local_628;
  undefined1 *local_618;
  undefined1 *local_608;
  undefined1 *local_600;
  long *local_5f8;
  undefined1 **local_5f0;
  char *local_5e8;
  undefined4 local_5c0;
  uint local_5bc;
  uint local_5b8;
  string local_5a0 [39];
  allocator<char> local_579;
  string local_578 [32];
  string local_558 [32];
  string local_538 [32];
  string local_518 [32];
  string local_4f8 [32];
  string local_4d8 [32];
  string local_4b8 [32];
  string local_498 [32];
  BRDPoint local_478;
  string local_470 [39];
  allocator<char> local_449;
  string local_448 [32];
  string local_428 [32];
  string local_408 [32];
  string local_3e8 [32];
  string local_3c8 [32];
  string local_3a8 [32];
  string local_388 [32];
  string local_368 [32];
  undefined1 *local_348;
  undefined1 *local_338;
  undefined1 *local_328;
  undefined1 *local_318;
  uint local_304;
  undefined1 local_300 [8];
  undefined1 local_2f8 [32];
  undefined1 *local_2d8;
  undefined1 local_2d0 [28];
  int local_2b4;
  int local_2b0;
  byte local_2a9;
  ulong local_2a8;
  undefined1 *local_2a0;
  long local_298;
  char *local_290;
  char *local_288;
  string local_280 [39];
  allocator<char> local_259;
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  size_t local_158;
  string local_150 [55];
  allocator<char> local_119;
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  size_type local_18;
  vector<char,_std::allocator<char>_> *local_10;
  
  local_10 = in_RSI;
  BRDFileBase::BRDFileBase(in_stack_fffffffffffff2d0);
  *in_RDI = &PTR__BRDFile_00302ef8;
  local_18 = std::vector<char,_std::allocator<char>_>::size(local_10);
  iVar3 = (int)((ulong)in_stack_fffffffffffff2c8 >> 0x20);
  if (local_18 < 5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff2c0,
               (char *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8),
               (allocator<char> *)in_stack_fffffffffffff2b0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff288,
                   (char *)CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280));
    std::__cxx11::to_string(iVar3);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8),
                   in_stack_fffffffffffff2b0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff288,
                   (char *)CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff288,
                   (char *)CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff288,
                   (char *)CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff288,
                   (char *)CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff288,
                   (char *)CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280));
    std::__cxx11::string::operator=((string *)(in_RDI + 0x13),local_38);
    std::__cxx11::string::~string(local_38);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_d8);
    std::__cxx11::string::~string(local_150);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator(&local_119);
    uVar4 = std::__cxx11::string::c_str();
    SDL_LogError(1,"%s",uVar4);
  }
  else {
    local_158 = (local_18 + 1) * 3;
    pvVar5 = calloc(1,local_158);
    iVar3 = (int)((ulong)in_stack_fffffffffffff2c8 >> 0x20);
    in_RDI[0x17] = pvVar5;
    if (in_RDI[0x17] == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff2c0,
                 (char *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8),
                 (allocator<char> *)in_stack_fffffffffffff2b0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff288,
                     (char *)CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280));
      std::__cxx11::to_string(iVar3);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8),
                     in_stack_fffffffffffff2b0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff288,
                     (char *)CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff288,
                     (char *)CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff288,
                     (char *)CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff288,
                     (char *)CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff288,
                     (char *)CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280));
      std::__cxx11::string::operator=((string *)(in_RDI + 0x13),local_178);
      std::__cxx11::string::~string(local_178);
      std::__cxx11::string::~string(local_198);
      std::__cxx11::string::~string(local_1b8);
      std::__cxx11::string::~string(local_1d8);
      std::__cxx11::string::~string(local_1f8);
      std::__cxx11::string::~string(local_218);
      std::__cxx11::string::~string(local_280);
      std::__cxx11::string::~string(local_238);
      std::__cxx11::string::~string(local_258);
      std::allocator<char>::~allocator(&local_259);
      uVar4 = std::__cxx11::string::c_str();
      SDL_LogError(1,"%s",uVar4);
    }
    else {
      local_288 = (char *)std::vector<char,_std::allocator<char>_>::begin
                                    ((vector<char,_std::allocator<char>_> *)
                                     in_stack_fffffffffffff278);
      local_290 = (char *)std::vector<char,_std::allocator<char>_>::end
                                    ((vector<char,_std::allocator<char>_> *)
                                     in_stack_fffffffffffff278);
      std::copy<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,char*>
                (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,
                 (char *)in_stack_fffffffffffff290);
      *(undefined1 *)(in_RDI[0x17] + local_18) = 0;
      local_298 = in_RDI[0x17] + local_18 + 1;
      local_2a0 = (undefined1 *)(in_RDI[0x17] + local_158 + -1);
      *local_2a0 = 0;
      if (*(int *)in_RDI[0x17] == 0x2863e223) {
        for (local_2a8 = 0; local_2a8 < local_18; local_2a8 = local_2a8 + 1) {
          local_2a9 = *(byte *)(in_RDI[0x17] + local_2a8);
          if (((local_2a9 != 0xd) && (local_2a9 != 10)) && (local_2a9 != 0)) {
            local_2b0 = (int)(char)local_2a9;
            local_2a9 = ((byte)(local_2b0 >> 6) & 3 | (byte)(local_2b0 << 2)) ^ 0xff;
          }
          *(byte *)(in_RDI[0x17] + local_2a8) = local_2a9;
        }
      }
      local_2b4 = 0;
      std::vector<char_*,_std::allocator<char_*>_>::vector
                ((vector<char_*,_std::allocator<char_*>_> *)0x16df1b);
      stringfile(in_stack_fffffffffffff2a0._M_current,
                 (vector<char_*,_std::allocator<char_*>_> *)in_stack_fffffffffffff298._M_current);
      local_2d8 = local_2d0;
      local_2f8._24_8_ =
           std::vector<char_*,_std::allocator<char_*>_>::begin
                     ((vector<char_*,_std::allocator<char_*>_> *)in_stack_fffffffffffff278);
      local_2f8._16_8_ =
           std::vector<char_*,_std::allocator<char_*>_>::end
                     ((vector<char_*,_std::allocator<char_*>_> *)in_stack_fffffffffffff278);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280),
                                (__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>
                                 *)in_stack_fffffffffffff278), bVar1) {
        ppcVar6 = __gnu_cxx::
                  __normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::
                  operator*((__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>
                             *)(local_2f8 + 0x18));
        local_2f8._8_8_ = *ppcVar6;
        while (iVar3 = isspace((uint)*(byte *)local_2f8._8_8_), iVar3 != 0) {
          local_2f8._8_8_ = local_2f8._8_8_ + 1;
        }
        if (*(byte *)local_2f8._8_8_ != 0) {
          iVar3 = strcmp((char *)local_2f8._8_8_,"str_length:");
          if (iVar3 == 0) {
            local_2b4 = 1;
          }
          else {
            iVar3 = strcmp((char *)local_2f8._8_8_,"var_data:");
            if (iVar3 == 0) {
              local_2b4 = 2;
            }
            else {
              iVar3 = strcmp((char *)local_2f8._8_8_,"Format:");
              if ((iVar3 == 0) || (iVar3 = strcmp((char *)local_2f8._8_8_,"format:"), iVar3 == 0)) {
                local_2b4 = 3;
              }
              else {
                iVar3 = strcmp((char *)local_2f8._8_8_,"Parts:");
                if ((iVar3 == 0) || (iVar3 = strcmp((char *)local_2f8._8_8_,"Pins1:"), iVar3 == 0))
                {
                  local_2b4 = 4;
                }
                else {
                  iVar3 = strcmp((char *)local_2f8._8_8_,"Pins:");
                  if ((iVar3 == 0) || (iVar3 = strcmp((char *)local_2f8._8_8_,"Pins2:"), iVar3 == 0)
                     ) {
                    local_2b4 = 5;
                  }
                  else {
                    iVar3 = strcmp((char *)local_2f8._8_8_,"Nails:");
                    if (iVar3 == 0) {
                      local_2b4 = 6;
                    }
                    else {
                      local_2f8._0_8_ = local_2f8._8_8_;
                      local_304 = 0;
                      switch(local_2b4) {
                      case 2:
                        local_318 = local_2f8;
                        uVar2 = BRDFile::anon_class_16_2_d7082a65::operator()
                                          (in_stack_fffffffffffff3c0);
                        *(uint *)(in_RDI + 1) = uVar2;
                        local_328 = local_2f8;
                        uVar2 = BRDFile::anon_class_16_2_d7082a65::operator()
                                          (in_stack_fffffffffffff3c0);
                        *(uint *)((long)in_RDI + 0xc) = uVar2;
                        local_338 = local_2f8;
                        uVar2 = BRDFile::anon_class_16_2_d7082a65::operator()
                                          (in_stack_fffffffffffff3c0);
                        *(uint *)(in_RDI + 2) = uVar2;
                        local_348 = local_2f8;
                        uVar2 = BRDFile::anon_class_16_2_d7082a65::operator()
                                          (in_stack_fffffffffffff3c0);
                        *(uint *)((long)in_RDI + 0x14) = uVar2;
                        break;
                      case 3:
                        sVar7 = std::vector<BRDPoint,_std::allocator<BRDPoint>_>::size
                                          ((vector<BRDPoint,_std::allocator<BRDPoint>_> *)
                                           (in_RDI + 3));
                        if (*(uint *)(in_RDI + 1) <= sVar7) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    (in_stack_fffffffffffff2c0,
                                     (char *)CONCAT44(in_stack_fffffffffffff2bc,
                                                      in_stack_fffffffffffff2b8),
                                     (allocator<char> *)in_stack_fffffffffffff2b0);
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff288,
                                         (char *)CONCAT44(in_stack_fffffffffffff284,
                                                          in_stack_fffffffffffff280));
                          std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff2c8 >> 0x20));
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)CONCAT44(in_stack_fffffffffffff2bc,
                                                     in_stack_fffffffffffff2b8),
                                         in_stack_fffffffffffff2b0);
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff288,
                                         (char *)CONCAT44(in_stack_fffffffffffff284,
                                                          in_stack_fffffffffffff280));
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff288,
                                         (char *)CONCAT44(in_stack_fffffffffffff284,
                                                          in_stack_fffffffffffff280));
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff288,
                                         (char *)CONCAT44(in_stack_fffffffffffff284,
                                                          in_stack_fffffffffffff280));
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff288,
                                         (char *)CONCAT44(in_stack_fffffffffffff284,
                                                          in_stack_fffffffffffff280));
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff288,
                                         (char *)CONCAT44(in_stack_fffffffffffff284,
                                                          in_stack_fffffffffffff280));
                          std::__cxx11::string::operator=((string *)(in_RDI + 0x13),local_368);
                          std::__cxx11::string::~string(local_368);
                          std::__cxx11::string::~string(local_388);
                          std::__cxx11::string::~string(local_3a8);
                          std::__cxx11::string::~string(local_3c8);
                          std::__cxx11::string::~string(local_3e8);
                          std::__cxx11::string::~string(local_408);
                          std::__cxx11::string::~string(local_470);
                          std::__cxx11::string::~string(local_428);
                          std::__cxx11::string::~string(local_448);
                          std::allocator<char>::~allocator(&local_449);
                          uVar4 = std::__cxx11::string::c_str();
                          SDL_LogError(1,"%s",uVar4);
                        }
                        BRDPoint::BRDPoint(&local_478);
                        lVar8 = strtol((char *)local_2f8._0_8_,(char **)local_2f8,10);
                        local_478.x = (int)lVar8;
                        lVar8 = strtol((char *)local_2f8._0_8_,(char **)local_2f8,10);
                        local_478.y = (int)lVar8;
                        std::vector<BRDPoint,_std::allocator<BRDPoint>_>::push_back
                                  ((vector<BRDPoint,_std::allocator<BRDPoint>_> *)
                                   in_stack_fffffffffffff290,(value_type *)in_stack_fffffffffffff288
                                  );
                        break;
                      case 4:
                        sVar7 = std::vector<BRDPart,_std::allocator<BRDPart>_>::size
                                          ((vector<BRDPart,_std::allocator<BRDPart>_> *)(in_RDI + 9)
                                          );
                        if (*(uint *)((long)in_RDI + 0xc) <= sVar7) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    (in_stack_fffffffffffff2c0,
                                     (char *)CONCAT44(in_stack_fffffffffffff2bc,
                                                      in_stack_fffffffffffff2b8),
                                     (allocator<char> *)in_stack_fffffffffffff2b0);
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff288,
                                         (char *)CONCAT44(in_stack_fffffffffffff284,
                                                          in_stack_fffffffffffff280));
                          std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff2c8 >> 0x20));
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)CONCAT44(in_stack_fffffffffffff2bc,
                                                     in_stack_fffffffffffff2b8),
                                         in_stack_fffffffffffff2b0);
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff288,
                                         (char *)CONCAT44(in_stack_fffffffffffff284,
                                                          in_stack_fffffffffffff280));
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff288,
                                         (char *)CONCAT44(in_stack_fffffffffffff284,
                                                          in_stack_fffffffffffff280));
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff288,
                                         (char *)CONCAT44(in_stack_fffffffffffff284,
                                                          in_stack_fffffffffffff280));
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff288,
                                         (char *)CONCAT44(in_stack_fffffffffffff284,
                                                          in_stack_fffffffffffff280));
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff288,
                                         (char *)CONCAT44(in_stack_fffffffffffff284,
                                                          in_stack_fffffffffffff280));
                          std::__cxx11::string::operator=((string *)(in_RDI + 0x13),local_498);
                          std::__cxx11::string::~string(local_498);
                          std::__cxx11::string::~string(local_4b8);
                          std::__cxx11::string::~string(local_4d8);
                          std::__cxx11::string::~string(local_4f8);
                          std::__cxx11::string::~string(local_518);
                          std::__cxx11::string::~string(local_538);
                          std::__cxx11::string::~string(local_5a0);
                          std::__cxx11::string::~string(local_558);
                          std::__cxx11::string::~string(local_578);
                          std::allocator<char>::~allocator(&local_579);
                          uVar4 = std::__cxx11::string::c_str();
                          SDL_LogError(1,"%s",uVar4);
                        }
                        BRDPart::BRDPart(in_stack_fffffffffffff290);
                        local_608 = local_2f8;
                        local_600 = local_300;
                        local_5f8 = &local_298;
                        local_5f0 = &local_2a0;
                        local_5e8 = BRDFile::anon_class_32_4_fa413470::operator()
                                              ((anon_class_32_4_fa413470 *)
                                               CONCAT44(in_stack_fffffffffffff284,
                                                        in_stack_fffffffffffff280));
                        local_618 = local_2f8;
                        local_304 = BRDFile::anon_class_16_2_d7082a65::operator()
                                              (in_stack_fffffffffffff3c0);
                        local_5bc = (uint)((local_304 & 0xc) == 0);
                        if ((local_304 == 1) || ((3 < local_304 && (local_304 < 8)))) {
                          local_5c0 = 2;
                        }
                        if ((local_304 == 2) || (7 < local_304)) {
                          local_5c0 = 1;
                        }
                        local_628 = local_2f8;
                        local_5b8 = BRDFile::anon_class_16_2_d7082a65::operator()
                                              (in_stack_fffffffffffff3c0);
                        if (*(uint *)(in_RDI + 2) < local_5b8) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    (in_stack_fffffffffffff2c0,
                                     (char *)CONCAT44(in_stack_fffffffffffff2bc,
                                                      in_stack_fffffffffffff2b8),
                                     (allocator<char> *)in_stack_fffffffffffff2b0);
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff288,
                                         (char *)CONCAT44(in_stack_fffffffffffff284,
                                                          in_stack_fffffffffffff280));
                          std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff2c8 >> 0x20));
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)CONCAT44(in_stack_fffffffffffff2bc,
                                                     in_stack_fffffffffffff2b8),
                                         in_stack_fffffffffffff2b0);
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff288,
                                         (char *)CONCAT44(in_stack_fffffffffffff284,
                                                          in_stack_fffffffffffff280));
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff288,
                                         (char *)CONCAT44(in_stack_fffffffffffff284,
                                                          in_stack_fffffffffffff280));
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff288,
                                         (char *)CONCAT44(in_stack_fffffffffffff284,
                                                          in_stack_fffffffffffff280));
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff288,
                                         (char *)CONCAT44(in_stack_fffffffffffff284,
                                                          in_stack_fffffffffffff280));
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff288,
                                         (char *)CONCAT44(in_stack_fffffffffffff284,
                                                          in_stack_fffffffffffff280));
                          std::__cxx11::string::operator=((string *)(in_RDI + 0x13),local_648);
                          std::__cxx11::string::~string(local_648);
                          std::__cxx11::string::~string(local_668);
                          std::__cxx11::string::~string(local_688);
                          std::__cxx11::string::~string(local_6a8);
                          std::__cxx11::string::~string(local_6c8);
                          std::__cxx11::string::~string(local_6e8);
                          std::__cxx11::string::~string(local_750);
                          std::__cxx11::string::~string(local_708);
                          std::__cxx11::string::~string(local_728);
                          std::allocator<char>::~allocator(&local_729);
                          uVar4 = std::__cxx11::string::c_str();
                          SDL_LogError(1,"%s",uVar4);
                        }
                        std::vector<BRDPart,_std::allocator<BRDPart>_>::push_back
                                  ((vector<BRDPart,_std::allocator<BRDPart>_> *)
                                   in_stack_fffffffffffff290,in_stack_fffffffffffff288);
                        BRDPart::~BRDPart((BRDPart *)0x16eef0);
                        break;
                      case 5:
                        sVar7 = std::vector<BRDPin,_std::allocator<BRDPin>_>::size
                                          ((vector<BRDPin,_std::allocator<BRDPin>_> *)(in_RDI + 0xc)
                                          );
                        if (*(uint *)(in_RDI + 2) <= sVar7) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    (in_stack_fffffffffffff2c0,
                                     (char *)CONCAT44(in_stack_fffffffffffff2bc,
                                                      in_stack_fffffffffffff2b8),
                                     (allocator<char> *)in_stack_fffffffffffff2b0);
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff288,
                                         (char *)CONCAT44(in_stack_fffffffffffff284,
                                                          in_stack_fffffffffffff280));
                          std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff2c8 >> 0x20));
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)CONCAT44(in_stack_fffffffffffff2bc,
                                                     in_stack_fffffffffffff2b8),
                                         in_stack_fffffffffffff2b0);
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff288,
                                         (char *)CONCAT44(in_stack_fffffffffffff284,
                                                          in_stack_fffffffffffff280));
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff288,
                                         (char *)CONCAT44(in_stack_fffffffffffff284,
                                                          in_stack_fffffffffffff280));
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff288,
                                         (char *)CONCAT44(in_stack_fffffffffffff284,
                                                          in_stack_fffffffffffff280));
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff288,
                                         (char *)CONCAT44(in_stack_fffffffffffff284,
                                                          in_stack_fffffffffffff280));
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff288,
                                         (char *)CONCAT44(in_stack_fffffffffffff284,
                                                          in_stack_fffffffffffff280));
                          std::__cxx11::string::operator=((string *)(in_RDI + 0x13),local_770);
                          std::__cxx11::string::~string(local_770);
                          std::__cxx11::string::~string(local_790);
                          std::__cxx11::string::~string(local_7b0);
                          std::__cxx11::string::~string(local_7d0);
                          std::__cxx11::string::~string(local_7f0);
                          std::__cxx11::string::~string(local_810);
                          std::__cxx11::string::~string(local_878);
                          std::__cxx11::string::~string(local_830);
                          std::__cxx11::string::~string(local_850);
                          std::allocator<char>::~allocator(&local_851);
                          uVar4 = std::__cxx11::string::c_str();
                          SDL_LogError(1,"%s",uVar4);
                        }
                        BRDPin::BRDPin((BRDPin *)
                                       CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280)
                                      );
                        lVar8 = strtol((char *)local_2f8._0_8_,(char **)local_2f8,10);
                        local_8b0 = (undefined4)lVar8;
                        lVar8 = strtol((char *)local_2f8._0_8_,(char **)local_2f8,10);
                        local_8ac = (undefined4)lVar8;
                        lVar8 = strtol((char *)local_2f8._0_8_,(char **)local_2f8,10);
                        local_8a8 = (undefined4)lVar8;
                        local_8c0 = (char **)local_2f8;
                        local_8a4 = BRDFile::anon_class_16_2_d7082a65::operator()
                                              (in_stack_fffffffffffff3c0);
                        if (*(uint *)((long)in_RDI + 0xc) < local_8a4) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    (in_stack_fffffffffffff2c0,
                                     (char *)CONCAT44(in_stack_fffffffffffff2bc,
                                                      in_stack_fffffffffffff2b8),
                                     (allocator<char> *)in_stack_fffffffffffff2b0);
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff288,
                                         (char *)CONCAT44(in_stack_fffffffffffff284,
                                                          in_stack_fffffffffffff280));
                          std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff2c8 >> 0x20));
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)CONCAT44(in_stack_fffffffffffff2bc,
                                                     in_stack_fffffffffffff2b8),
                                         in_stack_fffffffffffff2b0);
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff288,
                                         (char *)CONCAT44(in_stack_fffffffffffff284,
                                                          in_stack_fffffffffffff280));
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff288,
                                         (char *)CONCAT44(in_stack_fffffffffffff284,
                                                          in_stack_fffffffffffff280));
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff288,
                                         (char *)CONCAT44(in_stack_fffffffffffff284,
                                                          in_stack_fffffffffffff280));
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff288,
                                         (char *)CONCAT44(in_stack_fffffffffffff284,
                                                          in_stack_fffffffffffff280));
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff288,
                                         (char *)CONCAT44(in_stack_fffffffffffff284,
                                                          in_stack_fffffffffffff280));
                          std::__cxx11::string::operator=((string *)(in_RDI + 0x13),local_8e0);
                          std::__cxx11::string::~string(local_8e0);
                          std::__cxx11::string::~string(local_900);
                          std::__cxx11::string::~string(local_920);
                          std::__cxx11::string::~string(local_940);
                          std::__cxx11::string::~string(local_960);
                          std::__cxx11::string::~string(local_980);
                          std::__cxx11::string::~string(local_9e8);
                          std::__cxx11::string::~string(local_9a0);
                          std::__cxx11::string::~string(local_9c0);
                          std::allocator<char>::~allocator(&local_9c1);
                          uVar4 = std::__cxx11::string::c_str();
                          SDL_LogError(1,"%s",uVar4);
                        }
                        local_a08 = local_2f8;
                        local_a00 = local_300;
                        local_9f8 = &local_298;
                        local_9f0 = &local_2a0;
                        local_898 = BRDFile::anon_class_32_4_fa413470::operator()
                                              ((anon_class_32_4_fa413470 *)
                                               CONCAT44(in_stack_fffffffffffff284,
                                                        in_stack_fffffffffffff280));
                        std::vector<BRDPin,_std::allocator<BRDPin>_>::push_back
                                  ((vector<BRDPin,_std::allocator<BRDPin>_> *)
                                   in_stack_fffffffffffff290,(value_type *)in_stack_fffffffffffff288
                                  );
                        break;
                      case 6:
                        sVar7 = std::vector<BRDNail,_std::allocator<BRDNail>_>::size
                                          ((vector<BRDNail,_std::allocator<BRDNail>_> *)
                                           (in_RDI + 0xf));
                        iVar3 = (int)((ulong)in_stack_fffffffffffff2c8 >> 0x20);
                        if (*(uint *)((long)in_RDI + 0x14) <= sVar7) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    (in_stack_fffffffffffff2c0,
                                     (char *)CONCAT44(in_stack_fffffffffffff2bc,
                                                      in_stack_fffffffffffff2b8),
                                     (allocator<char> *)in_stack_fffffffffffff2b0);
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff288,
                                         (char *)CONCAT44(in_stack_fffffffffffff284,
                                                          in_stack_fffffffffffff280));
                          std::__cxx11::to_string(iVar3);
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)CONCAT44(in_stack_fffffffffffff2bc,
                                                     in_stack_fffffffffffff2b8),
                                         in_stack_fffffffffffff2b0);
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff288,
                                         (char *)CONCAT44(in_stack_fffffffffffff284,
                                                          in_stack_fffffffffffff280));
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff288,
                                         (char *)CONCAT44(in_stack_fffffffffffff284,
                                                          in_stack_fffffffffffff280));
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff288,
                                         (char *)CONCAT44(in_stack_fffffffffffff284,
                                                          in_stack_fffffffffffff280));
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff288,
                                         (char *)CONCAT44(in_stack_fffffffffffff284,
                                                          in_stack_fffffffffffff280));
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff288,
                                         (char *)CONCAT44(in_stack_fffffffffffff284,
                                                          in_stack_fffffffffffff280));
                          in_stack_fffffffffffff2c8 = (string *)(in_RDI + 0x13);
                          in_stack_fffffffffffff2c0 = &local_a28;
                          std::__cxx11::string::operator=
                                    (in_stack_fffffffffffff2c8,(string *)in_stack_fffffffffffff2c0);
                          std::__cxx11::string::~string((string *)in_stack_fffffffffffff2c0);
                          std::__cxx11::string::~string(local_a48);
                          std::__cxx11::string::~string(local_a68);
                          std::__cxx11::string::~string(local_a88);
                          std::__cxx11::string::~string(local_aa8);
                          std::__cxx11::string::~string(local_ac8);
                          std::__cxx11::string::~string(local_b30);
                          std::__cxx11::string::~string(local_ae8);
                          std::__cxx11::string::~string(local_b08);
                          std::allocator<char>::~allocator(&local_b09);
                          uVar4 = std::__cxx11::string::c_str();
                          SDL_LogError(1,"%s",uVar4);
                        }
                        BRDNail::BRDNail((BRDNail *)
                                         CONCAT44(in_stack_fffffffffffff284,
                                                  in_stack_fffffffffffff280));
                        local_b58 = local_2f8;
                        in_stack_fffffffffffff2bc =
                             BRDFile::anon_class_16_2_d7082a65::operator()
                                       (in_stack_fffffffffffff3c0);
                        in_stack_fffffffffffff2b0 =
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_2f8;
                        local_b48 = in_stack_fffffffffffff2bc;
                        lVar8 = strtol((char *)local_2f8._0_8_,(char **)in_stack_fffffffffffff2b0,10
                                      );
                        local_b44 = (undefined4)lVar8;
                        lVar8 = strtol((char *)local_2f8._0_8_,(char **)in_stack_fffffffffffff2b0,10
                                      );
                        local_b40 = (undefined4)lVar8;
                        local_b68 = in_stack_fffffffffffff2b0;
                        in_stack_fffffffffffff2b8 =
                             BRDFile::anon_class_16_2_d7082a65::operator()
                                       (in_stack_fffffffffffff3c0);
                        local_b3c = (in_stack_fffffffffffff2b8 == 1) + 1;
                        local_b88 = local_2f8;
                        local_b80 = local_300;
                        local_b78 = &local_298;
                        local_b70 = &local_2a0;
                        local_b38 = BRDFile::anon_class_32_4_fa413470::operator()
                                              ((anon_class_32_4_fa413470 *)
                                               CONCAT44(in_stack_fffffffffffff284,
                                                        in_stack_fffffffffffff280));
                        std::vector<BRDNail,_std::allocator<BRDNail>_>::push_back
                                  ((vector<BRDNail,_std::allocator<BRDNail>_> *)
                                   in_stack_fffffffffffff290,(value_type *)in_stack_fffffffffffff288
                                  );
                      }
                    }
                  }
                }
              }
            }
          }
        }
        __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::
        operator++((__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_> *)
                   (local_2f8 + 0x18));
      }
      std::
      unordered_map<int,_const_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
      ::unordered_map((unordered_map<int,_const_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
                       *)0x16fbc7);
      local_bc8 = in_RDI + 0xf;
      local_bd0._M_current =
           (BRDNail *)
           std::vector<BRDNail,_std::allocator<BRDNail>_>::begin(in_stack_fffffffffffff278);
      local_bd8 = (BRDNail *)
                  std::vector<BRDNail,_std::allocator<BRDNail>_>::end(in_stack_fffffffffffff278);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<BRDNail_*,_std::vector<BRDNail,_std::allocator<BRDNail>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280),
                                (__normal_iterator<BRDNail_*,_std::vector<BRDNail,_std::allocator<BRDNail>_>_>
                                 *)in_stack_fffffffffffff278), bVar1) {
        local_be0 = __gnu_cxx::
                    __normal_iterator<BRDNail_*,_std::vector<BRDNail,_std::allocator<BRDNail>_>_>::
                    operator*(&local_bd0);
        in_stack_fffffffffffff290 = (BRDPart *)local_be0->net;
        local_be4 = local_be0->probe;
        ppcVar10 = std::
                   unordered_map<int,_const_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
                   ::operator[]((unordered_map<int,_const_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280),
                                (key_type *)in_stack_fffffffffffff278);
        *ppcVar10 = (mapped_type)in_stack_fffffffffffff290;
        __gnu_cxx::__normal_iterator<BRDNail_*,_std::vector<BRDNail,_std::allocator<BRDNail>_>_>::
        operator++(&local_bd0);
      }
      local_bf0 = in_RDI + 0xc;
      local_bf8._M_current =
           (BRDPin *)
           std::vector<BRDPin,_std::allocator<BRDPin>_>::begin
                     ((vector<BRDPin,_std::allocator<BRDPin>_> *)in_stack_fffffffffffff278);
      std::vector<BRDPin,_std::allocator<BRDPin>_>::end
                ((vector<BRDPin,_std::allocator<BRDPin>_> *)in_stack_fffffffffffff278);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<BRDPin_*,_std::vector<BRDPin,_std::allocator<BRDPin>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280),
                                (__normal_iterator<BRDPin_*,_std::vector<BRDPin,_std::allocator<BRDPin>_>_>
                                 *)in_stack_fffffffffffff278), bVar1) {
        pBVar9 = __gnu_cxx::
                 __normal_iterator<BRDPin_*,_std::vector<BRDPin,_std::allocator<BRDPin>_>_>::
                 operator*(&local_bf8);
        iVar3 = strcmp(pBVar9->net,"");
        if (iVar3 == 0) {
          ppcVar10 = std::
                     unordered_map<int,_const_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
                     ::at((unordered_map<int,_const_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
                           *)CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280),
                          (key_type *)in_stack_fffffffffffff278);
          pBVar9->net = *ppcVar10;
        }
        pvVar11 = std::vector<BRDPart,_std::allocator<BRDPart>_>::operator[]
                            ((vector<BRDPart,_std::allocator<BRDPart>_> *)(in_RDI + 9),
                             (ulong)(pBVar9->part - 1));
        in_stack_fffffffffffff284 = pvVar11->mounting_side;
        if (in_stack_fffffffffffff284 == Both) {
          pBVar9->side = Both;
        }
        else if (in_stack_fffffffffffff284 == Bottom) {
          pBVar9->side = Bottom;
        }
        else if (in_stack_fffffffffffff284 == Top) {
          pBVar9->side = Top;
        }
        __gnu_cxx::__normal_iterator<BRDPin_*,_std::vector<BRDPin,_std::allocator<BRDPin>_>_>::
        operator++(&local_bf8);
      }
      *(bool *)(in_RDI + 0x12) = local_2b4 != 0;
      std::
      unordered_map<int,_const_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
      ::~unordered_map((unordered_map<int,_const_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
                        *)0x16fe7a);
      std::vector<char_*,_std::allocator<char_*>_>::~vector
                ((vector<char_*,_std::allocator<char_*>_> *)in_stack_fffffffffffff290);
    }
  }
  return;
}

Assistant:

BRDFile::BRDFile(std::vector<char> &buf) {
	auto buffer_size = buf.size();
	ENSURE_OR_FAIL(buffer_size > 4, error_msg, return);
	size_t file_buf_size = 3 * (1 + buffer_size);
	file_buf             = (char *)calloc(1, file_buf_size);
	ENSURE_OR_FAIL(file_buf != nullptr, error_msg, return);

	std::copy(buf.begin(), buf.end(), file_buf);
	file_buf[buffer_size] = 0;
	// This is for fixing degenerate utf8
	char *arena     = &file_buf[buffer_size + 1];
	char *arena_end = file_buf + file_buf_size - 1;
	*arena_end      = 0;

	// decode the file if it appears to be encoded:
	static const uint8_t encoded_header[] = {0x23, 0xe2, 0x63, 0x28};
	if (!memcmp(file_buf, encoded_header, 4)) {
		for (size_t i = 0; i < buffer_size; i++) {
			char x = file_buf[i];
			if (!(x == '\r' || x == '\n' || !x)) {
				int c = x;
				x     = ~(((c >> 6) & 3) | (c << 2));
			}
			file_buf[i] = x;
		}
	}

	int current_block = 0;
	std::vector<char*> lines;
	stringfile(file_buf, lines);

	for (char *line : lines) {
		while (isspace((uint8_t)*line)) line++;
		if (!line[0]) continue;
		if (!strcmp(line, "str_length:")) {
			current_block = 1;
			continue;
		}
		if (!strcmp(line, "var_data:")) {
			current_block = 2;
			continue;
		}
		if (!strcmp(line, "Format:") || !strcmp(line, "format:")) {
			current_block = 3;
			continue;
		}
		if (!strcmp(line, "Parts:") || !strcmp(line, "Pins1:")) {
			current_block = 4;
			continue;
		}
		if (!strcmp(line, "Pins:") || !strcmp(line, "Pins2:")) {
			current_block = 5;
			continue;
		}
		if (!strcmp(line, "Nails:")) {
			current_block = 6;
			continue;
		}

		char *p = line;
		char *s;
		unsigned int tmp = 0;

		switch (current_block) {
			case 2: { // var_data
				num_format = READ_UINT();
				num_parts  = READ_UINT();
				num_pins   = READ_UINT();
				num_nails  = READ_UINT();
			} break;
			case 3: { // Format
				ENSURE(format.size() < num_format, error_msg);
				BRDPoint fmt;
				fmt.x = strtol(p, &p, 10);
				fmt.y = strtol(p, &p, 10);
				format.push_back(fmt);
			} break;
			case 4: { // Parts
				ENSURE(parts.size() < num_parts, error_msg);
				BRDPart part;
				part.name      = READ_STR();
				tmp            = READ_UINT(); // Type and layer, actually.
				part.part_type = (tmp & 0xc) ? BRDPartType::SMD : BRDPartType::ThroughHole;
				if (tmp == 1 || (4 <= tmp && tmp < 8)) part.mounting_side = BRDPartMountingSide::Top;
				if (tmp == 2 || (8 <= tmp)) part.mounting_side            = BRDPartMountingSide::Bottom;
				part.end_of_pins                                          = READ_UINT();
				ENSURE(part.end_of_pins <= num_pins, error_msg);
				parts.push_back(part);
			} break;
			case 5: { // Pins
				ENSURE(pins.size() < num_pins, error_msg);
				BRDPin pin;
				pin.pos.x = READ_INT();
				pin.pos.y = READ_INT();
				pin.probe = READ_INT(); // Can be negative (-99)
				pin.part  = READ_UINT();
				ENSURE(pin.part <= num_parts, error_msg);
				pin.net = READ_STR();
				pins.push_back(pin);
			} break;
			case 6: { // Nails
				ENSURE(nails.size() < num_nails, error_msg);
				BRDNail nail;
				nail.probe = READ_UINT();
				nail.pos.x = READ_INT();
				nail.pos.y = READ_INT();
				nail.side  = READ_UINT() == 1 ? BRDPartMountingSide::Top : BRDPartMountingSide::Bottom;
				nail.net   = READ_STR();
				nails.push_back(nail);
			} break;
		}
	}

	// Lenovo brd variant, find net from nail
	std::unordered_map<int, const char *> nailsToNets; // Map between net id and net name
	for (auto &nail : nails) {
		nailsToNets[nail.probe] = nail.net;
	}

	for (auto &pin : pins) {
		if (!strcmp(pin.net, "")) {
			try {
				pin.net = nailsToNets.at(pin.probe);
			} catch (const std::out_of_range &e) {
				pin.net = "";
			}
		}
		switch (parts[pin.part - 1].mounting_side) {
			case BRDPartMountingSide::Top:    pin.side = BRDPinSide::Top;    break;
			case BRDPartMountingSide::Bottom: pin.side = BRDPinSide::Bottom; break;
			case BRDPartMountingSide::Both:   pin.side = BRDPinSide::Both;   break;
		}
	}

	valid = current_block != 0;
}